

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_ternary_Test::TestBody(expr_ternary_Test *this)

{
  Generator *pGVar1;
  Var *pVVar2;
  Var *pVVar3;
  Var *pVVar4;
  char *pcVar5;
  undefined1 local_978 [8];
  Generator mod;
  Context c;
  ConditionalExpr result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)&local_50);
  pGVar1 = kratos::Context::generator
                     ((Context *)&mod.use_stmts_remove_cache_,
                      (string *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::Generator((Generator *)local_978,pGVar1);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"cond",
             (allocator<char> *)&local_50);
  pVVar2 = kratos::Generator::var
                     ((Generator *)local_978,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"a",(allocator<char> *)&local_50
            );
  pVVar3 = kratos::Generator::var
                     ((Generator *)local_978,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"b",(allocator<char> *)&local_50
            );
  pVVar4 = kratos::Generator::var
                     ((Generator *)local_978,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar2->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_30,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar3->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&result.condition,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar4->super_enable_shared_from_this<kratos::Var>);
  kratos::ConditionalExpr::ConditionalExpr
            ((ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,
             (shared_ptr<kratos::Var> *)&local_50,(shared_ptr<kratos::Var> *)local_30,
             (shared_ptr<kratos::Var> *)&result.condition);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  kratos::ConditionalExpr::to_string_abi_cxx11_
            (&local_50,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_30,"result.to_string()","\"cond ? a: b\"",&local_50,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe6,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            (&local_50,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_30,"result.handle_name(true)","\"cond ? a: b\"",&local_50,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe7,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            (&local_50,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,false);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[24]>
            ((internal *)local_30,"result.handle_name(false)","\"mod.cond ? mod.a: mod.b\"",
             &local_50,(char (*) [24])"mod.cond ? mod.a: mod.b");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe8,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            (&local_50,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,
             (Generator *)local_978);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_30,"result.handle_name(&mod)","\"cond ? a: b\"",&local_50,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe9,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Var::~Var((Var *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::~Generator((Generator *)local_978);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, ternary) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &cond = mod.var("cond", 1);
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto result =
        ConditionalExpr(cond.shared_from_this(), a.shared_from_this(), b.shared_from_this());
    EXPECT_EQ(result.to_string(), "cond ? a: b");
    EXPECT_EQ(result.handle_name(true), "cond ? a: b");
    EXPECT_EQ(result.handle_name(false), "mod.cond ? mod.a: mod.b");
    EXPECT_EQ(result.handle_name(&mod), "cond ? a: b");
}